

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int __thiscall CGraph::solve(CGraph *this,int room)

{
  pointer pCVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  int iVar6;
  
  iVar6 = (this->m_weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[room];
  if (iVar6 != -1) {
    return iVar6;
  }
  pCVar1 = (this->m_building).super__Vector_base<CGraph::CNode,_std::allocator<CGraph::CNode>_>.
           _M_impl.super__Vector_impl_data._M_start + room;
  iVar6 = pCVar1->m_weight;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"tn ",3);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,room);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pCVar1->m_next1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  plVar5 = (long *)std::ostream::operator<<(poVar4,pCVar1->m_next2);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  iVar3 = pCVar1->m_next1;
  if (iVar3 == 0) {
    iVar3 = pCVar1->m_next2;
    if (iVar3 == 0) goto LAB_00102a35;
LAB_00102a2d:
    iVar3 = solve(this,iVar3);
  }
  else {
    if (pCVar1->m_next2 == 0) goto LAB_00102a2d;
    if ((iVar3 == 0) || (pCVar1->m_next2 == 0)) goto LAB_00102a35;
    iVar2 = solve(this,iVar3);
    iVar3 = solve(this,pCVar1->m_next2);
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
  }
  iVar6 = iVar6 + iVar3;
LAB_00102a35:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"fr ",3);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,room);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  plVar5 = (long *)std::ostream::operator<<(poVar4,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  (this->m_weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[room] = iVar6;
  return iVar6;
}

Assistant:

int solve(int room) const
        {
            if (-1 != m_weights[room])
            {
                return m_weights[room];
            }
            const CNode& n = m_building[room];
            int result = n.weight();
            std::cerr << "tn " << room << " " << n.top() << " " << n.right() << std::endl;
            if (0 == n.top() && 0 != n.right())
            {
                result += solve(n.right());
            } else if (0 != n.top() && 0 == n.right())
            {
                result += solve(n.top());
            } else if (0 != n.top() && 0 != n.right())
            {
                result += std::max(solve(n.top()), solve(n.right()));
            } else  // both is zero
            {
                // nothing
            }
            std::cerr << "fr " << room << " " << result << std::endl;
            m_weights[room] = result;
            return result;
        }